

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O0

void * __thiscall
std::pmr::test_resource::do_allocate(test_resource *this,size_t bytes,size_t alignment)

{
  undefined4 *puVar1;
  longlong index;
  long lVar2;
  lock_guard<std::mutex> lVar3;
  bool bVar4;
  atomic_llong *paVar5;
  bad_alloc *pbVar6;
  longlong lVar7;
  test_resource_exception *this_00;
  undefined4 *puVar8;
  longlong lVar9;
  Link *pLVar10;
  size_type sVar11;
  const_pointer pvVar12;
  char *pcVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  void *address;
  Link *link;
  AlignedHeader *head;
  longlong allocationIndex;
  lock_guard<std::mutex> guard;
  size_t alignment_local;
  size_t bytes_local;
  test_resource *this_local;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_3;
  memory_order __b_2;
  
  guard._M_device = (mutex_type *)alignment;
  lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&allocationIndex,&this->m_lock_);
  paVar5 = &this->m_allocations_;
  LOCK();
  index = (paVar5->super___atomic_base<long_long>)._M_i;
  (paVar5->super___atomic_base<long_long>)._M_i = (paVar5->super___atomic_base<long_long>)._M_i + 1;
  UNLOCK();
  if ((mutex_type *)0x10 < guard._M_device) {
    pbVar6 = (bad_alloc *)__cxa_allocate_exception(8);
    bad_alloc::bad_alloc(pbVar6);
    __cxa_throw(pbVar6,&bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  lVar7 = allocation_limit(this);
  if (-1 < lVar7) {
    paVar5 = &this->m_allocation_limit_;
    LOCK();
    lVar2 = (paVar5->super___atomic_base<long_long>)._M_i;
    (paVar5->super___atomic_base<long_long>)._M_i =
         (paVar5->super___atomic_base<long_long>)._M_i + -1;
    UNLOCK();
    if (lVar2 + -1 < 0) {
      this_00 = (test_resource_exception *)__cxa_allocate_exception(0x20);
      test_resource_exception::test_resource_exception(this_00,this,bytes,(size_t)guard._M_device);
      __cxa_throw(this_00,&test_resource_exception::typeinfo,
                  test_resource_exception::~test_resource_exception);
    }
  }
  puVar8 = (undefined4 *)memory_resource::allocate(this->m_pmr_,bytes + 0x50,0x10);
  if (puVar8 == (undefined4 *)0x0) {
    pbVar6 = (bad_alloc *)__cxa_allocate_exception(8);
    bad_alloc::bad_alloc(pbVar6);
    __cxa_throw(pbVar6,&bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  operator&(memory_order_relaxed,__memory_order_mask);
  lVar3 = guard;
  (this->m_last_allocated_num_bytes_).super___atomic_base<unsigned_long>._M_i = bytes;
  operator&(memory_order_relaxed,__memory_order_mask);
  (this->m_last_allocated_alignment_).super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict1)lVar3._M_device;
  auVar15 = pshuflw(ZEXT216(0xb1b1),ZEXT216(0xb1b1),0);
  uVar14 = auVar15._0_4_;
  puVar8[0xc] = uVar14;
  puVar8[0xd] = uVar14;
  puVar8[0xe] = uVar14;
  puVar8[0xf] = uVar14;
  auVar15 = pshuflw(ZEXT216(0xb1b1),ZEXT216(0xb1b1),0);
  uVar14 = auVar15._0_4_;
  puVar1 = (undefined4 *)((long)puVar8 + bytes + 0x40);
  *puVar1 = uVar14;
  puVar1[1] = uVar14;
  puVar1[2] = uVar14;
  puVar1[3] = uVar14;
  *(size_t *)(puVar8 + 2) = bytes;
  *(mutex_type **)(puVar8 + 4) = guard._M_device;
  *puVar8 = 0xdeadbeef;
  *(longlong *)(puVar8 + 6) = index;
  LOCK();
  (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i =
       (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i + 1;
  UNLOCK();
  lVar7 = max_blocks(this);
  lVar9 = blocks_in_use(this);
  if (lVar7 < lVar9) {
    lVar7 = blocks_in_use(this);
    operator&(memory_order_relaxed,__memory_order_mask);
    (this->m_max_blocks_).super___atomic_base<long_long>._M_i = lVar7;
  }
  LOCK();
  (this->m_total_blocks_).super___atomic_base<long_long>._M_i =
       (this->m_total_blocks_).super___atomic_base<long_long>._M_i + 1;
  UNLOCK();
  LOCK();
  (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i =
       (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i + bytes;
  UNLOCK();
  lVar7 = max_bytes(this);
  lVar9 = bytes_in_use(this);
  if (lVar7 < lVar9) {
    lVar7 = bytes_in_use(this);
    operator&(memory_order_relaxed,__memory_order_mask);
    (this->m_max_bytes_).super___atomic_base<long_long>._M_i = lVar7;
  }
  LOCK();
  (this->m_total_bytes_).super___atomic_base<unsigned_long>._M_i =
       (this->m_total_bytes_).super___atomic_base<unsigned_long>._M_i + bytes;
  UNLOCK();
  pLVar10 = addLink(this->m_list_,index,this->m_pmr_);
  *(Link **)(puVar8 + 8) = pLVar10;
  *(test_resource **)(puVar8 + 10) = this;
  puVar8 = puVar8 + 0x10;
  atomic<void_*>::store(&this->m_last_allocated_address_,puVar8,memory_order_relaxed);
  bVar4 = is_verbose(this);
  if (bVar4) {
    printf("test_resource");
    bVar4 = basic_string_view<char,_std::char_traits<char>_>::empty(&this->m_name_);
    if (!bVar4) {
      sVar11 = basic_string_view<char,_std::char_traits<char>_>::length(&this->m_name_);
      pvVar12 = basic_string_view<char,_std::char_traits<char>_>::data(&this->m_name_);
      printf(" %.*s",sVar11 & 0xffffffff,pvVar12);
    }
    pcVar13 = "s ";
    if (bytes == 1) {
      pcVar13 = " ";
    }
    printf(" [%lld]: Allocated %zu byte%s(aligned %zu) at %p.\n",index,bytes,pcVar13,guard._M_device
           ,puVar8);
    fflush(_stdout);
  }
  lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&allocationIndex);
  return puVar8;
}

Assistant:

void *test_resource::do_allocate(size_t bytes, size_t alignment)
{
    lock_guard guard{ m_lock_ };

    long long allocationIndex = m_allocations_.fetch_add(1,
                                                         memory_order_relaxed);

    if (alignment > alignof(max_align_t)) {
        // Over-aligned allocations are not currently supported.
        throw bad_alloc();
    }

    if (0 <= allocation_limit()) {
        if (0 > m_allocation_limit_.fetch_add(-1, memory_order_relaxed) - 1) {
            throw test_resource_exception(this, bytes, alignment);
        }
    }

    AlignedHeader *head = (AlignedHeader *)m_pmr_->allocate(
                                  sizeof(AlignedHeader) + bytes + paddingSize);
    if (!head) {
        // We cannot satisfy this request.  Throw 'std::bad_alloc'.

        throw bad_alloc();
    }

    m_last_allocated_num_bytes_.store(static_cast<long long>(bytes),
                                      memory_order_relaxed);
    m_last_allocated_alignment_.store(static_cast<long long>(alignment),
                                      memory_order_relaxed);

    // Note that we don't initialize the user portion of the segment because
    // that would undermine Purify's 'UMR: uninitialized memory read' checking.

    std::memset((char *)(head + 1) - paddingSize,
                to_integer<unsigned char>(paddedMemoryByte), paddingSize);
    std::memset((char *)(head + 1) + bytes,
                to_integer<unsigned char>(paddedMemoryByte), paddingSize);

    head->m_object_.m_bytes_        = bytes;
    head->m_object_.m_alignment_    = alignment;
    head->m_object_.m_magic_number_ = allocatedMemoryPattern;
    head->m_object_.m_index_        = allocationIndex;

    m_blocks_in_use_.fetch_add(1, memory_order_relaxed);
    if (max_blocks() < blocks_in_use()) {
        m_max_blocks_.store(blocks_in_use(), memory_order_relaxed);
    }
    m_total_blocks_.fetch_add(1, memory_order_relaxed);

    m_bytes_in_use_.fetch_add(static_cast<long long>(bytes),
                              memory_order_relaxed);
    if (max_bytes() < bytes_in_use()) {
        m_max_bytes_.store(bytes_in_use(), memory_order_relaxed);
    }
    m_total_bytes_.fetch_add(static_cast<long long>(bytes),
                             memory_order_relaxed);

    Link *link = addLink(m_list_, allocationIndex, m_pmr_);
    head->m_object_.m_address_ = link;
    head->m_object_.m_pmr_      = this;

    void *address = ++head;

    m_last_allocated_address_.store(address, memory_order_relaxed);

    if (is_verbose()) {

        // In verbose mode, print a message to 'stdout' -- e.g.,
        //..
        //  TestAllocator global [25]: Allocated 128 bytes at 0xc3a281a8.
        //..

        printf("test_resource");

        if (!m_name_.empty()) {
            printf(" %.*s",
                   static_cast<int>(m_name_.length()), m_name_.data());
        }

        printf(" [%lld]: Allocated %zu byte%s(aligned %zu) at %p.\n",
               allocationIndex,
               bytes,
               1 == bytes ? " " : "s ",
               alignment,
               address);

        std::fflush(stdout);
    }

    return address;
}